

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardIO.cpp
# Opt level: O3

bool __thiscall BoardIO::WriteIPv4Address(BoardIO *this,uint32_t IPaddr)

{
  BasePort *pBVar1;
  int iVar2;
  ulong uVar3;
  
  pBVar1 = this->port;
  if (pBVar1 != (BasePort *)0x0) {
    uVar3 = (ulong)this->BoardId;
    if ((uVar3 < 0x10) && (6 < (uint)pBVar1->FirmwareVersion[uVar3])) {
      iVar2 = (*pBVar1->_vptr_BasePort[0x24])(pBVar1,uVar3,0xb,IPaddr);
      return SUB41(iVar2,0);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"BoardIO::WriteIPv4Address: requires firmware 7 or above",0x37);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
  std::ostream::put('0');
  std::ostream::flush();
  return false;
}

Assistant:

bool BoardIO::WriteIPv4Address(uint32_t IPaddr)
{
    if (GetFirmwareVersion() < 7) {
        std::cerr << "BoardIO::WriteIPv4Address: requires firmware 7 or above" << std::endl;
        return false;
    }
    return (port ? port->WriteQuadlet(BoardId, BoardIO::IP_ADDR, IPaddr) : false);
}